

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_arg_id(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            *this)

{
  uint uVar1;
  int in_ECX;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_38;
  type local_28;
  
  uVar1 = (this->parse_context).next_arg_id_;
  if (-1 < (int)uVar1) {
    (this->parse_context).next_arg_id_ = uVar1 + 1;
    internal::
    get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
              ((format_arg *)&local_38.string,(internal *)&this->context,
               (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
                *)(ulong)uVar1,in_ECX);
    (this->arg).type_ = local_28;
    (this->arg).value_.field_0.long_long_value = local_38.long_long_value;
    (this->arg).value_.field_0.string.size = local_38.string.size;
    return;
  }
  internal::error_handler::on_error
            ((error_handler *)this,"cannot switch from manual to automatic argument indexing");
}

Assistant:

OutputIt copy_str(InputIt begin, InputIt end, OutputIt it) {
  return std::transform(begin, end, it, to_char8_t);
}